

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_service.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::ServiceGenerator::GenerateNotImplementedMethods
          (ServiceGenerator *this,Printer *printer)

{
  int iVar1;
  undefined8 *in_RDI;
  Formatter format;
  MethodDescriptor *method;
  int i;
  Options *in_stack_00000088;
  MethodDescriptor *in_stack_00000090;
  Printer *in_stack_ffffffffffffff78;
  char *in_stack_ffffffffffffffb8;
  Formatter *in_stack_ffffffffffffffc0;
  int local_14;
  
  local_14 = 0;
  while( true ) {
    iVar1 = ServiceDescriptor::method_count((ServiceDescriptor *)*in_RDI);
    if (iVar1 <= local_14) break;
    ServiceDescriptor::method((ServiceDescriptor *)*in_RDI,local_14);
    Formatter::Formatter
              ((Formatter *)&stack0xffffffffffffffa8,in_stack_ffffffffffffff78,
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)0x52196f);
    anon_unknown_3::InitMethodVariables(in_stack_00000090,in_stack_00000088,(Formatter *)this);
    Formatter::operator()<>(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    Formatter::~Formatter((Formatter *)0x5219a6);
    local_14 = local_14 + 1;
  }
  return;
}

Assistant:

void ServiceGenerator::GenerateNotImplementedMethods(io::Printer* printer) {
  for (int i = 0; i < descriptor_->method_count(); i++) {
    const MethodDescriptor* method = descriptor_->method(i);
    Formatter format(printer, vars_);
    InitMethodVariables(method, options_, &format);
    format(
        "void $classname$::$name$(::$proto_ns$::RpcController* controller,\n"
        "                         const $input_type$*,\n"
        "                         $output_type$*,\n"
        "                         ::google::protobuf::Closure* done) {\n"
        "  controller->SetFailed(\"Method $name$() not implemented.\");\n"
        "  done->Run();\n"
        "}\n"
        "\n");
  }
}